

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O0

bool __thiscall
banksia::TourMng::pairingMatchListRecusive
          (TourMng *this,
          vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *playerVec,int round,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pairedSet)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pairedSet_00;
  TourMng *in_RCX;
  undefined4 in_EDX;
  TourMng *in_RSI;
  char *in_RDI;
  MatchRecord record;
  int swap;
  string name1;
  value_type *player1;
  int j;
  string name0;
  value_type *player0;
  int i;
  bool r;
  size_type n;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe18;
  undefined5 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe25;
  undefined1 in_stack_fffffffffffffe26;
  byte in_stack_fffffffffffffe27;
  const_iterator in_stack_fffffffffffffe28;
  TourMng *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe7f;
  string *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  MatchRecord *in_stack_fffffffffffffe90;
  uint local_f8;
  int local_f4;
  _Self local_f0;
  string local_e8 [32];
  string local_c8 [32];
  _Self local_a8;
  string local_a0 [48];
  reference local_70;
  int local_64;
  string local_60 [32];
  reference local_40;
  int local_38;
  byte local_31;
  undefined4 in_stack_ffffffffffffffe0;
  byte local_1;
  
  pairedSet_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::size
                              ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)
                               in_RSI);
  local_31 = 1;
  for (local_38 = 0;
      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)(long)local_38 < pairedSet_00; local_38 = local_38 + 1) {
    local_40 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::at
                         ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)
                          CONCAT17(in_stack_fffffffffffffe27,
                                   CONCAT16(in_stack_fffffffffffffe26,
                                            CONCAT15(in_stack_fffffffffffffe25,
                                                     in_stack_fffffffffffffe20))),
                          (size_type)in_stack_fffffffffffffe18);
    if ((local_40->flag & 1U) == 0) {
      local_31 = 0;
      std::__cxx11::string::string(local_60,(string *)&local_40->name);
      local_40->flag = local_40->flag | 1;
      this_00 = in_RCX;
      local_64 = local_38;
      do {
        do {
          local_64 = local_64 + 1;
          if (pairedSet_00 <=
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(long)local_64) {
            local_40->flag = local_40->flag & 0xfffffffe;
            local_f4 = 0;
            in_RCX = this_00;
            goto LAB_0019bf02;
          }
          local_70 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::at
                               ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *
                                )CONCAT17(in_stack_fffffffffffffe27,
                                          CONCAT16(in_stack_fffffffffffffe26,
                                                   CONCAT15(in_stack_fffffffffffffe25,
                                                            in_stack_fffffffffffffe20))),
                                (size_type)in_stack_fffffffffffffe18);
        } while ((local_70->flag & 1U) != 0);
        std::__cxx11::string::string(local_a0,(string *)&local_70->name);
        in_RCX = this_00;
        std::operator+(in_stack_fffffffffffffe48,in_RDI);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe28._M_node,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffe27,
                                CONCAT16(in_stack_fffffffffffffe26,
                                         CONCAT15(in_stack_fffffffffffffe25,
                                                  in_stack_fffffffffffffe20))));
        in_stack_fffffffffffffe28 =
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(in_stack_fffffffffffffe18,(key_type *)0x19bc80);
        local_a8._M_node = in_stack_fffffffffffffe28._M_node;
        local_f0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_fffffffffffffe18);
        in_stack_fffffffffffffe27 = std::operator!=(&local_a8,&local_f0);
        std::__cxx11::string::~string(local_c8);
        std::__cxx11::string::~string(local_e8);
        if ((in_stack_fffffffffffffe27 & 1) == 0) {
          local_70->flag = local_70->flag | 1;
          in_stack_fffffffffffffe26 =
               pairingMatchListRecusive
                         (in_RSI,(vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                                  *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                          (int)((ulong)in_RCX >> 0x20),pairedSet_00);
          if ((bool)in_stack_fffffffffffffe26) {
            local_f8 = rand();
            local_f8 = local_f8 & 1;
            if (*(int *)(in_RDI + 0x1a8) == 2) {
              local_f8 = (uint)(local_70->whiteCnt < local_40->whiteCnt);
            }
            in_stack_fffffffffffffe25 = (in_RDI[0x35d] & 1U) != 0 && local_f8 != 0;
            MatchRecord::MatchRecord
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80
                       ,(bool)in_stack_fffffffffffffe7f);
            addMatchRecord(this_00,(MatchRecord *)in_stack_fffffffffffffe28._M_node);
            local_1 = 1;
            local_f4 = 1;
            MatchRecord::~MatchRecord((MatchRecord *)this_00);
          }
          else {
            local_70->flag = local_70->flag & 0xfffffffe;
            local_f4 = 7;
          }
        }
        else {
          local_f4 = 7;
        }
        std::__cxx11::string::~string(local_a0);
        this_00 = in_RCX;
      } while (local_f4 == 7);
LAB_0019bf02:
      std::__cxx11::string::~string(local_60);
      if (local_f4 != 0) goto LAB_0019bf55;
    }
  }
  local_1 = local_31 & 1;
LAB_0019bf55:
  return (bool)(local_1 & 1);
}

Assistant:

bool TourMng::pairingMatchListRecusive(std::vector<TourPlayer>& playerVec, int round, const std::set<std::string>& pairedSet)
{
    auto n = playerVec.size(); assert((n & 1) == 0); // must be even
    
    auto r = true;
    for(int i = 0; i < n; ++i) {
        auto& player0 = playerVec.at(i);
        if (player0.flag & 1) continue;
        r = false;
        auto name0 = player0.name;
        player0.flag |= 1;
        
        for(int j = i + 1; j < n; ++j) {
            auto& player1 = playerVec.at(j);
            if (player1.flag & 1) continue;
            auto name1 = player1.name;
            
            if (pairedSet.find(name0 + "*" + name1) != pairedSet.end()) {
                continue;
            }
            
            player1.flag |= 1;
            
            if (!pairingMatchListRecusive(playerVec, round, pairedSet)) {
                player1.flag &= ~1;
                continue;
            }
            
            // random swap to avoid name0 player plays all white side
            auto swap = rand() & 1;
            
            if (type == TourType::swiss) {
                swap = player0.whiteCnt > player1.whiteCnt;
            }
            MatchRecord record(name0, name1, swapPairSides && swap);
            record.round = round;
            addMatchRecord(record);
            return true;
        }
        player0.flag &= ~1;
        
    }
    return r;
}